

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  int local_40;
  int local_3c;
  
  if (argc < 2) {
    printUsage(argv,0);
    local_40 = 1;
  }
  else {
    local_3c = 0;
    uVar7 = 1;
    bVar4 = false;
    local_40 = 0;
    do {
      pcVar2 = argv[uVar7];
      bVar3 = false;
      if (*pcVar2 == '-') {
        cVar1 = pcVar2[1];
        if (((cVar1 == '\0') ||
            ((pcVar2[2] == '\0' && (pvVar6 = memchr("xyXYqc",(int)cVar1,7), pvVar6 == (void *)0x0)))
            ) || ((pcVar2[3] == '\0' &&
                  (pvVar6 = memchr("xyXY",(int)cVar1,5), pvVar6 != (void *)0x0)))) {
          iVar5 = (int)uVar7;
LAB_0012bb74:
          printUsage(argv,iVar5);
          local_40 = 1;
          bVar3 = true;
        }
        else {
          bVar3 = false;
          if (cVar1 == '-') {
            iVar5 = strncmp(pcVar2 + 2,"arithmetic=",0xb);
            if (iVar5 == 0) {
              if (pcVar2[0xd] == '2') {
                if (local_3c == 0) {
                  local_3c = 0x32;
                }
                bVar4 = true;
              }
              else if (pcVar2[0xd] == '1') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Cannot set arithmetic type to quadprecision - Soplex compiled without quadprecision support\n"
                           ,0x5c);
                iVar5 = 0;
                goto LAB_0012bb74;
              }
            }
            else {
              iVar5 = strncmp(pcVar2 + 2,"precision=",10);
              if (iVar5 == 0) {
                local_3c = atoi(pcVar2 + 0xc);
              }
            }
          }
        }
      }
      if (bVar3) {
        return local_40;
      }
      uVar7 = uVar7 + 1;
    } while ((uint)argc != uVar7);
    if (!bVar4 && local_3c != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Setting precision to non-default value without enabling multiprecision solve has no effect\n"
                 ,0x5b);
    }
    if (bVar4) {
      if (local_3c < 0x33) {
        runSoPlex<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (argc,argv);
      }
      else if (local_3c < 0x65) {
        runSoPlex<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (argc,argv);
      }
      else {
        runSoPlex<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (argc,argv);
      }
    }
    else if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Wrong value for the arithmetic mode\n",0x24);
      local_40 = 0;
    }
    else {
      runSoPlex<double>(argc,argv);
    }
  }
  return local_40;
}

Assistant:

int main(int argc, char* argv[])
{
   int arithmetic = 0;
   int precision = 0;
   int optidx;

   // find out which precision/solvemode soplex should be run in. the rest happens in runSoPlex
   // no options were given
   if(argc <= 1)
   {
      printUsage(argv, 0);
      return 1;
   }

   // read arguments from command line
   for(optidx = 1; optidx < argc; optidx++)
   {
      char* option = argv[optidx];

      // we reached <lpfile>
      if(option[0] != '-')
         continue;

      // option string must start with '-', followed by at least one character;
      // allowed two-character options are -x, -y, -X, -Y, -q, and -c,
      // but -x, -y, -X and -Y may have also parameters.
      if(option[1] == '\0'
            || (option[2] == '\0' && strchr("xyXYqc", option[1]) == nullptr)
            || (option[3] == '\0' && strchr("xyXY", option[1]) != nullptr))
      {
         printUsage(argv, optidx);
         return 1;
      }

      switch(option[1])
      {
      case '-' :
         option = &option[2];

         // --arithmetic=<value> : choose base arithmetic type (0 - double, 1 - quadprecision, 2 - higher multiprecision)
         // only need to do something here if multi or quad, the rest is handled in runSoPlex
         if(strncmp(option, "arithmetic=", 11) == 0)
         {
            if(option[11] == '1')
            {
#ifndef SOPLEX_WITH_FLOAT128
               SPX_MSG_ERROR(std::cerr <<
                             "Cannot set arithmetic type to quadprecision - Soplex compiled without quadprecision support\n";)
               printUsage(argv, 0);
               return 1;
#else
               arithmetic = 1;
#endif
            }
            else if(option[11] == '2')
            {
#ifndef SOPLEX_WITH_BOOST
               SPX_MSG_ERROR(std::cerr <<
                             "Cannot set arithmetic type to multiprecision - Soplex compiled without boost\n";)
               printUsage(argv, 0);
               return 1;
#else
               arithmetic = 2;

               // default precision in multiprecision solve is 50
               if(precision == 0)
                  precision = 50;

#endif
            }
         }
         // set precision
         else if(strncmp(option, "precision=", 10) == 0)
         {
            precision = atoi(option + 10);
#ifndef SOPLEX_WITH_BOOST
            SPX_MSG_ERROR(std::cerr << "Setting precision to non-default value without Boost has no effect\n";)
#endif
         }

         break;

      default:
         break;
      }
   }

   if(precision != 0 && arithmetic != 2)
   {
      SPX_MSG_ERROR(std::cerr <<
                    "Setting precision to non-default value without enabling multiprecision solve has no effect\n";)
   }

   switch(arithmetic)
   {
   case 0:                 // double
      runSoPlex<Real>(argc, argv);
      break;

#ifdef SOPLEX_WITH_BOOST
#ifdef SOPLEX_WITH_FLOAT128

   case 1:                // quadprecision
#if BOOST_VERSION < 107000
      std::cerr << "Error: Boost version too old." << std:: endl <<
                "In order to use the quadprecision feature of SoPlex," <<
                " Boost Version 1.70.0 or higher is required." << std::endl << \
                "Included Boost version is " << BOOST_VERSION / 100000 << "."  // maj. version
                << BOOST_VERSION / 100 % 1000 << "."  // min. version
                << BOOST_VERSION % 100                // patch version;
                << std::endl;
#else
      using namespace boost::multiprecision;
      using Quad = boost::multiprecision::float128;
      runSoPlex<Quad>(argc, argv);
#endif
      break;
#endif

   case 2:                 // soplex mpf
      using namespace boost::multiprecision;

#if BOOST_VERSION < 107000
      std::cerr << "Error: Boost version too old." << std:: endl <<
                "In order to use the multiprecision feature of SoPlex," <<
                " Boost Version 1.70.0 or higher is required." << std::endl << \
                "Included Boost version is " << BOOST_VERSION / 100000 << "."  // maj. version
                << BOOST_VERSION / 100 % 1000 << "."  // min. version
                << BOOST_VERSION % 100                // patch version;
                << std::endl;
#else
#ifdef SOPLEX_WITH_MPFR

      // et_off means the expression templates options is turned off. TODO:
      // The documentation also mentions about static vs dynamic memory
      // allocation for the mpfr types. Is it relevant here? I probably also
      // need to have the mpfr_float_eto in the global soplex namespace
      using multiprecision = number<mpfr_float_backend<0>, et_off>;
      multiprecision::default_precision(precision);
      runSoPlex<multiprecision>(argc, argv);
#endif  // SOPLEX_WITH_MPFR

#ifdef SOPLEX_WITH_CPPMPF
      // It seems that precision cannot be set on run time for cpp_float
      // backend for boost::number. So a precision of 50 decimal points is
      // set.
      using multiprecision1 = number<cpp_dec_float<50>, et_off>;
      using multiprecision2 = number<cpp_dec_float<100>, et_off>;
      using multiprecision3 = number<cpp_dec_float<200>, et_off>;

      if(precision <= 50)
         runSoPlex<multiprecision1>(argc, argv);
      else if(precision <= 100)
         runSoPlex<multiprecision2>(argc, argv);
      else
         runSoPlex<multiprecision3>(argc, argv);

#endif  // SOPLEX_WITH_CPPMPF
#endif
      break;
#endif

   // coverity[dead_error_begin]
   default:
      std::cerr << "Wrong value for the arithmetic mode\n";
      return 0;
   }
}